

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

bool __thiscall llvm::Triple::isLittleEndian(Triple *this)

{
  ArchType AVar1;
  Triple *this_local;
  
  AVar1 = getArch(this);
  if ((((((AVar1 == arm) || (AVar1 == aarch64)) || (AVar1 - avr < 2)) ||
       ((AVar1 == hexagon || (AVar1 == mipsel)))) ||
      ((AVar1 - mips64el < 3 || ((AVar1 - ppc64le < 5 || (AVar1 == sparcel)))))) ||
     ((AVar1 - tcele < 2 || ((AVar1 - x86 < 0xf || (AVar1 - wasm32 < 4)))))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Triple::isLittleEndian() const {
  switch (getArch()) {
  case Triple::aarch64:
  case Triple::amdgcn:
  case Triple::amdil64:
  case Triple::amdil:
  case Triple::arm:
  case Triple::avr:
  case Triple::bpfel:
  case Triple::hexagon:
  case Triple::hsail64:
  case Triple::hsail:
  case Triple::kalimba:
  case Triple::le32:
  case Triple::le64:
  case Triple::mips64el:
  case Triple::mipsel:
  case Triple::msp430:
  case Triple::nios2:
  case Triple::nvptx64:
  case Triple::nvptx:
  case Triple::ppc64le:
  case Triple::r600:
  case Triple::riscv32:
  case Triple::riscv64:
  case Triple::shave:
  case Triple::sparcel:
  case Triple::spir64:
  case Triple::spir:
  case Triple::thumb:
  case Triple::wasm32:
  case Triple::wasm64:
  case Triple::x86:
  case Triple::x86_64:
  case Triple::xcore:
  case Triple::tcele:
  case Triple::renderscript32:
  case Triple::renderscript64:
    return true;
  default:
    return false;
  }
}